

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

bool __thiscall tetgenio::load_medit(tetgenio *this,char *filebasename,int istetmesh)

{
  polygon **pppVar1;
  double **ppdVar2;
  double dVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  char *result;
  size_t sVar7;
  FILE *__stream;
  polygon *ppVar8;
  polygon *ppVar9;
  long lVar10;
  facet *pfVar11;
  double *pdVar12;
  polygon *ppVar13;
  int *piVar14;
  facet *pfVar15;
  int *piVar16;
  ulong uVar17;
  long lVar18;
  byte bVar19;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar20;
  char *__format;
  tetgenio *ptVar21;
  ulong uVar22;
  uint uVar23;
  bool bVar24;
  char *bufferp;
  char infilename [1024];
  char buffer [2048];
  polygon *local_cb8;
  tetgenio *local_cb0;
  facet *local_ca8;
  ulong local_ca0;
  undefined8 local_c98;
  long local_c90;
  int *local_c88;
  int local_c7c;
  undefined8 local_c78;
  long local_c70;
  undefined8 local_c68;
  polygon *local_c60;
  long local_c58;
  ulong local_c50;
  long local_c48;
  undefined8 local_c40;
  char local_c38 [4];
  undefined2 auStack_c34 [509];
  undefined1 local_839;
  char local_838 [2056];
  
  strncpy(local_c38,filebasename,0x3ff);
  local_839 = 0;
  if (local_c38[0] == '\0') {
    puts("Error:  No filename.");
    bVar24 = false;
  }
  else {
    sVar7 = strlen(local_c38);
    iVar5 = strcmp(local_c38 + (sVar7 - 5),".mesh");
    if (iVar5 != 0) {
      sVar7 = strlen(local_c38);
      builtin_strncpy(local_c38 + sVar7,".mes",4);
      *(undefined2 *)((long)auStack_c34 + sVar7) = 0x68;
    }
    __stream = fopen(local_c38,"r");
    if (__stream == (FILE *)0x0) {
      bVar24 = false;
      printf("Error:  Unable to open file %s\n",local_c38);
    }
    else {
      local_c7c = istetmesh;
      printf("Opening %s.\n",local_c38);
      local_c40 = 0x3fffffff8;
      uVar23 = 0;
      local_c70 = 0;
      local_c98 = (int *)((ulong)local_c98._4_4_ << 0x20);
      local_c58 = 0;
      local_ca0 = 0;
      ptVar21 = this;
      local_cb0 = this;
      ppVar9 = (polygon *)0x0;
LAB_00111ab8:
      local_c60 = ppVar9;
      ppVar8 = (polygon *)fgets(local_838,0x7ff,__stream);
      while (uVar23 = uVar23 + 1, ppVar8 != (polygon *)0x0) {
        while( true ) {
          uVar22 = (ulong)*(byte *)&ppVar8->vertexlist;
          if (0x20 < uVar22) goto LAB_00111b12;
          if ((0x100000200U >> (uVar22 & 0x3f) & 1) == 0) break;
          ppVar8 = (polygon *)((long)&ppVar8->vertexlist + 1);
        }
        if ((0x2401UL >> (uVar22 & 0x3f) & 1) == 0) goto LAB_00111b12;
        ppVar8 = (polygon *)fgets(local_838,0x7ff,__stream);
      }
      ppVar8 = (polygon *)0x0;
LAB_00111b12:
      local_cb8 = ppVar8;
      if (ppVar8 != (polygon *)0x0) {
        ppVar9 = local_c60;
        if (*(char *)&ppVar8->vertexlist != '#') {
          bVar24 = (int)local_c70 == 0;
          if (bVar24) {
            ppVar9 = (polygon *)strstr((char *)ppVar8,"Dimension");
            if (ppVar9 == (polygon *)0x0) {
              ppVar9 = (polygon *)strstr((char *)ppVar8,"dimension");
            }
            if (ppVar9 == (polygon *)0x0) {
              ppVar9 = (polygon *)strstr((char *)ppVar8,"DIMENSION");
            }
            if (ppVar9 == (polygon *)0x0) {
              local_c70 = 0;
            }
            else {
              while ((0x2c < (ulong)*(byte *)&ppVar9->vertexlist ||
                     ((0x100900000201U >> ((ulong)*(byte *)&ppVar9->vertexlist & 0x3f) & 1) == 0)))
              {
                ppVar9 = (polygon *)((long)&ppVar9->vertexlist + 1);
              }
LAB_00111bac:
              uVar22 = (ulong)*(byte *)&ppVar9->vertexlist;
              if (0x2e < uVar22) {
LAB_00111bc1:
                if (0xf5 < (byte)(*(byte *)&ppVar9->vertexlist - 0x3a)) goto LAB_00111bd9;
                ppVar9 = (polygon *)((long)&ppVar9->vertexlist + 1);
                goto LAB_00111bac;
              }
              if ((0x680000000001U >> (uVar22 & 0x3f) & 1) != 0) goto LAB_00111bd9;
              if (uVar22 != 0x23) goto LAB_00111bc1;
              *(char *)&ppVar9->vertexlist = '\0';
LAB_00111bd9:
              local_cb8 = ppVar9;
              if (*(char *)&ppVar9->vertexlist == '\0') {
                while( true ) {
                  ppVar9 = (polygon *)fgets(local_838,0x7ff,__stream);
                  uVar23 = uVar23 + 1;
                  if (ppVar9 == (polygon *)0x0) break;
                  while( true ) {
                    uVar22 = (ulong)*(byte *)&ppVar9->vertexlist;
                    if (0x20 < uVar22) goto LAB_00111c21;
                    if ((0x100000200U >> (uVar22 & 0x3f) & 1) == 0) break;
                    ppVar9 = (polygon *)((long)&ppVar9->vertexlist + 1);
                  }
                  if ((0x2401UL >> (uVar22 & 0x3f) & 1) == 0) goto LAB_00111c21;
                }
                ppVar9 = (polygon *)0x0;
              }
LAB_00111c21:
              local_cb8 = ppVar9;
              lVar10 = strtol((char *)local_cb8,(char **)&local_cb8,0);
              if ((int)lVar10 - 4U < 0xfffffffe) {
                __format = "Unknown dimension in file on line %d in file %s\n";
                goto LAB_0011291d;
              }
              ptVar21->mesh_dim = (int)lVar10;
              local_c70 = lVar10;
            }
          }
          ppVar9 = local_cb8;
          if ((int)local_c60 == 0) {
            ppVar8 = (polygon *)strstr((char *)local_cb8,"Vertices");
            if (ppVar8 == (polygon *)0x0) {
              ppVar8 = (polygon *)strstr((char *)ppVar9,"vertices");
            }
            if (ppVar8 == (polygon *)0x0) {
              ppVar8 = (polygon *)strstr((char *)ppVar9,"VERTICES");
            }
            ptVar21 = local_cb0;
            if (ppVar8 != (polygon *)0x0) {
              while ((0x2c < (ulong)*(byte *)&ppVar8->vertexlist ||
                     ((0x100900000201U >> ((ulong)*(byte *)&ppVar8->vertexlist & 0x3f) & 1) == 0)))
              {
                ppVar8 = (polygon *)((long)&ppVar8->vertexlist + 1);
              }
LAB_001126d0:
              uVar22 = (ulong)*(byte *)&ppVar8->vertexlist;
              if (uVar22 < 0x2f) {
                if ((0x680000000001U >> (uVar22 & 0x3f) & 1) != 0) goto LAB_001126f2;
                if (uVar22 == 0x23) {
                  *(char *)&ppVar8->vertexlist = '\0';
LAB_001126f2:
                  local_cb8 = ppVar8;
                  if (*(char *)&ppVar8->vertexlist == '\0') {
                    while( true ) {
                      ppVar8 = (polygon *)fgets(local_838,0x7ff,__stream);
                      uVar23 = uVar23 + 1;
                      if (ppVar8 == (polygon *)0x0) break;
                      while( true ) {
                        uVar22 = (ulong)*(byte *)&ppVar8->vertexlist;
                        if (0x20 < uVar22) goto LAB_0011273a;
                        if ((0x100000200U >> (uVar22 & 0x3f) & 1) == 0) break;
                        ppVar8 = (polygon *)((long)&ppVar8->vertexlist + 1);
                      }
                      if ((0x2401UL >> (uVar22 & 0x3f) & 1) == 0) goto LAB_0011273a;
                    }
                    ppVar8 = (polygon *)0x0;
                  }
LAB_0011273a:
                  local_cb8 = ppVar8;
                  ppVar9 = (polygon *)strtol((char *)local_cb8,(char **)&local_cb8,0);
                  uVar6 = (uint)ppVar9;
                  if (0 < (int)uVar6) {
                    ptVar21->numberofpoints = uVar6;
                    pdVar12 = (double *)operator_new__((long)ppVar9 * 0x18 & 0x7fffffff8);
                    ptVar21->pointlist = pdVar12;
                  }
                  local_ca0 = (ulong)(uVar6 + 1);
                  if (0 < (int)uVar6) {
                    local_ca8 = (facet *)(ulong)(uVar6 & 0x7fffffff);
                    ppVar8 = (polygon *)0x0;
LAB_00112796:
                    do {
                      ppVar9 = (polygon *)fgets(local_838,0x7ff,__stream);
                      uVar23 = uVar23 + 1;
                      if (ppVar9 == (polygon *)0x0) {
                        ppVar9 = (polygon *)0x0;
                      }
                      else {
                        for (; uVar22 = (ulong)*(byte *)&ppVar9->vertexlist, uVar22 < 0x21;
                            ppVar9 = (polygon *)((long)&ppVar9->vertexlist + 1)) {
                          if ((0x100000200U >> (uVar22 & 0x3f) & 1) == 0) {
                            if ((0x2401UL >> (uVar22 & 0x3f) & 1) != 0) goto LAB_00112796;
                            break;
                          }
                        }
                      }
                      local_cb8 = ppVar9;
                      if (ppVar9 == (polygon *)0x0) goto LAB_0011294c;
                      pdVar12 = ptVar21->pointlist;
                      lVar10 = 0;
                      local_c60 = ppVar8;
                      do {
                        if (*(char *)&local_cb8->vertexlist == '\0') {
                          printf("Syntax error reading vertex coords on line");
                          __format = " %d in file %s\n";
                          goto LAB_0011291d;
                        }
                        if ((lVar10 == 2) && ((int)local_c70 != 3)) {
                          pdVar12[(long)ppVar8 * 3 + 2] = 0.0;
                        }
                        else {
                          dVar3 = strtod((char *)local_cb8,(char **)&local_cb8);
                          pdVar12[(long)ppVar8 * 3 + lVar10] = dVar3;
                        }
                        while ((0x2c < (ulong)*(byte *)&local_cb8->vertexlist ||
                               ((0x100900000201U >> ((ulong)*(byte *)&local_cb8->vertexlist & 0x3f)
                                & 1) == 0))) {
                          local_cb8 = (polygon *)((long)&local_cb8->vertexlist + 1);
                        }
LAB_0011285d:
                        uVar22 = (ulong)*(byte *)&local_cb8->vertexlist;
                        if (0x2e < uVar22) {
LAB_00112872:
                          if (0xf5 < (byte)(*(byte *)&local_cb8->vertexlist - 0x3a))
                          goto LAB_0011287f;
                          local_cb8 = (polygon *)((long)&local_cb8->vertexlist + 1);
                          goto LAB_0011285d;
                        }
                        if ((0x680000000001U >> (uVar22 & 0x3f) & 1) != 0) goto LAB_0011287f;
                        if (uVar22 != 0x23) goto LAB_00112872;
                        *(char *)&local_cb8->vertexlist = '\0';
LAB_0011287f:
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      ppVar8 = (polygon *)((long)&local_c60->vertexlist + 1);
                      ptVar21 = local_cb0;
                      ppVar9 = (polygon *)0x1;
                    } while ((facet *)ppVar8 != local_ca8);
                  }
                  goto LAB_00111ab8;
                }
              }
              if (0xf5 < (byte)(*(byte *)&ppVar8->vertexlist - 0x3a)) goto LAB_001126f2;
              ppVar8 = (polygon *)((long)&ppVar8->vertexlist + 1);
              goto LAB_001126d0;
            }
          }
          ppVar9 = local_cb8;
          bVar24 = (int)local_c58 == 0;
          if (bVar24) {
            ppVar8 = (polygon *)strstr((char *)local_cb8,"Tetrahedra");
            if (ppVar8 == (polygon *)0x0) {
              ppVar8 = (polygon *)strstr((char *)ppVar9,"tetrahedra");
            }
            if (ppVar8 == (polygon *)0x0) {
              ppVar8 = (polygon *)strstr((char *)ppVar9,"TETRAHEDRA");
            }
            ptVar21 = local_cb0;
            ppVar9 = ppVar8;
            if (ppVar8 == (polygon *)0x0) {
              lVar10 = 0;
            }
            else {
              while ((0x2c < (ulong)*(byte *)&ppVar9->vertexlist ||
                     ((0x100900000201U >> ((ulong)*(byte *)&ppVar9->vertexlist & 0x3f) & 1) == 0)))
              {
                ppVar9 = (polygon *)((long)&ppVar9->vertexlist + 1);
              }
LAB_00111dc8:
              uVar22 = (ulong)*(byte *)&ppVar9->vertexlist;
              if (0x2e < uVar22) {
LAB_00111de5:
                if (0xf5 < (byte)(*(byte *)&ppVar9->vertexlist - 0x3a)) goto LAB_00111edd;
                ppVar9 = (polygon *)((long)&ppVar9->vertexlist + 1);
                goto LAB_00111dc8;
              }
              if ((0x680000000001U >> (uVar22 & 0x3f) & 1) != 0) goto LAB_00111edd;
              if (uVar22 != 0x23) goto LAB_00111de5;
              *(char *)&ppVar9->vertexlist = '\0';
LAB_00111edd:
              local_cb8 = ppVar9;
              if (*(char *)&ppVar9->vertexlist == '\0') {
                while( true ) {
                  ppVar9 = (polygon *)fgets(local_838,0x7ff,__stream);
                  uVar23 = uVar23 + 1;
                  if (ppVar9 == (polygon *)0x0) break;
                  while( true ) {
                    uVar22 = (ulong)*(byte *)&ppVar9->vertexlist;
                    if (0x20 < uVar22) goto LAB_00111f25;
                    if ((0x100000200U >> (uVar22 & 0x3f) & 1) == 0) break;
                    ppVar9 = (polygon *)((long)&ppVar9->vertexlist + 1);
                  }
                  if ((0x2401UL >> (uVar22 & 0x3f) & 1) == 0) goto LAB_00111f25;
                }
                ppVar9 = (polygon *)0x0;
              }
LAB_00111f25:
              local_cb8 = ppVar9;
              lVar10 = strtol((char *)local_cb8,(char **)&local_cb8,0);
              uVar6 = (uint)lVar10;
              if (0 < (int)uVar6) {
                ptVar21->numberoftetrahedra = uVar6;
                ptVar21->numberofcorners = 4;
                ptVar21->numberoftetrahedronattributes = 1;
                piVar14 = (int *)operator_new__((ulong)(uVar6 & 0x3fffffff) << 4);
                ptVar21->tetrahedronlist = piVar14;
                pdVar12 = (double *)operator_new__(lVar10 << 3 & local_c40);
                ptVar21->tetrahedronattributelist = pdVar12;
              }
            }
            local_c58 = lVar10;
            if (0 < ptVar21->numberoftetrahedra) {
              ppVar9 = (polygon *)0x0;
              do {
                piVar14 = ptVar21->tetrahedronlist;
                local_ca8 = (facet *)ppVar9;
                while( true ) {
                  ppVar13 = (polygon *)fgets(local_838,0x7ff,__stream);
                  uVar23 = uVar23 + 1;
                  if (ppVar13 == (polygon *)0x0) break;
                  while( true ) {
                    uVar22 = (ulong)*(byte *)&ppVar13->vertexlist;
                    if (0x20 < uVar22) goto LAB_00111ff1;
                    if ((0x100000200U >> (uVar22 & 0x3f) & 1) == 0) break;
                    ppVar13 = (polygon *)((long)&ppVar13->vertexlist + 1);
                  }
                  if ((0x2401UL >> (uVar22 & 0x3f) & 1) == 0) goto LAB_00111ff1;
                }
                ppVar13 = (polygon *)0x0;
LAB_00111ff1:
                local_cb8 = ppVar13;
                if (ppVar13 == (polygon *)0x0) goto LAB_0011294c;
                if (ppVar8 != (polygon *)0x0) {
                  uVar22 = 0;
                  do {
                    if (*(char *)&local_cb8->vertexlist == '\0') goto LAB_00112913;
                    uVar17 = strtol((char *)local_cb8,(char **)&local_cb8,0);
                    piVar14[(long)ppVar9 * 4 + uVar22] = (int)uVar17;
                    if ((int)uVar17 <= (int)local_ca0) {
                      local_ca0 = uVar17;
                    }
                    local_ca0 = local_ca0 & 0xffffffff;
                    while ((0x2c < (ulong)*(byte *)&local_cb8->vertexlist ||
                           ((0x100900000201U >> ((ulong)*(byte *)&local_cb8->vertexlist & 0x3f) & 1)
                            == 0))) {
                      local_cb8 = (polygon *)((long)&local_cb8->vertexlist + 1);
                    }
LAB_00112061:
                    uVar17 = (ulong)*(byte *)&local_cb8->vertexlist;
                    if (0x2e < uVar17) {
LAB_00112076:
                      if (0xf5 < (byte)(*(byte *)&local_cb8->vertexlist - 0x3a)) goto LAB_00112083;
                      local_cb8 = (polygon *)((long)&local_cb8->vertexlist + 1);
                      goto LAB_00112061;
                    }
                    if ((0x680000000001U >> (uVar17 & 0x3f) & 1) != 0) goto LAB_00112083;
                    if (uVar17 != 0x23) goto LAB_00112076;
                    *(undefined1 *)&local_cb8->vertexlist = 0;
LAB_00112083:
                  } while ((ppVar8 != (polygon *)0x0) &&
                          (bVar24 = uVar22 < 3, uVar22 = uVar22 + 1, bVar24));
                }
                pfVar11 = local_ca8;
                ptVar21 = local_cb0;
                local_cb0->tetrahedronattributelist[(long)local_ca8] = 0.0;
                if (*(char *)&local_cb8->vertexlist != '\0') {
                  lVar10 = strtol((char *)local_cb8,(char **)&local_cb8,0);
                  ptVar21->tetrahedronattributelist[(long)pfVar11] = (double)lVar10;
                }
                ppVar9 = (polygon *)((long)&pfVar11->polygonlist + 1);
              } while ((long)ppVar9 < (long)ptVar21->numberoftetrahedra);
            }
          }
          ppVar8 = local_cb8;
          ppVar9 = local_c60;
          if ((int)local_c98 == 0) {
            pfVar11 = (facet *)strstr((char *)local_cb8,"Triangles");
            if (pfVar11 == (facet *)0x0) {
              pfVar11 = (facet *)strstr((char *)ppVar8,"triangles");
            }
            if (pfVar11 == (facet *)0x0) {
              pfVar11 = (facet *)strstr((char *)ppVar8,"TRIANGLES");
            }
            local_c98 = (int *)((ulong)local_c98 & 0xffffffff00000000);
            if (pfVar11 == (facet *)0x0) {
              ppVar13 = (polygon *)strstr((char *)ppVar8,"Quadrilaterals");
              uVar20 = extraout_RDX;
              if (ppVar13 == (polygon *)0x0) {
                ppVar13 = (polygon *)strstr((char *)ppVar8,"quadrilaterals");
                uVar20 = extraout_RDX_00;
              }
              if (ppVar13 == (polygon *)0x0) {
                ppVar13 = (polygon *)strstr((char *)ppVar8,"QUADRILATERALS");
                uVar20 = extraout_RDX_01;
              }
              if (ppVar13 == (polygon *)0x0) {
                ppVar13 = (polygon *)0x0;
                bVar19 = 0;
                local_c68 = 0;
                local_c78 = 0;
              }
              else {
                local_c78 = 4;
                bVar19 = 1;
                local_c68 = CONCAT71((int7)((ulong)uVar20 >> 8),1);
              }
            }
            else {
              local_c78 = 3;
              local_c68 = 1;
              bVar19 = 0;
              ppVar13 = (polygon *)pfVar11;
            }
            ptVar21 = local_cb0;
            ppVar9 = local_c60;
            if (!(bool)(pfVar11 == (facet *)0x0 & (bVar19 ^ 1))) {
              while ((0x2c < (ulong)*(byte *)&ppVar13->vertexlist ||
                     ((0x100900000201U >> ((ulong)*(byte *)&ppVar13->vertexlist & 0x3f) & 1) == 0)))
              {
                ppVar13 = (polygon *)((long)&ppVar13->vertexlist + 1);
              }
LAB_00111eb0:
              uVar22 = (ulong)*(byte *)&ppVar13->vertexlist;
              if (uVar22 < 0x2f) {
                if ((0x680000000001U >> (uVar22 & 0x3f) & 1) != 0) goto LAB_00112106;
                if (uVar22 == 0x23) {
                  *(char *)&ppVar13->vertexlist = '\0';
LAB_00112106:
                  local_cb8 = ppVar13;
                  if (*(char *)&ppVar13->vertexlist == '\0') {
                    while( true ) {
                      ppVar13 = (polygon *)fgets(local_838,0x7ff,__stream);
                      uVar23 = uVar23 + 1;
                      if (ppVar13 == (polygon *)0x0) break;
                      while( true ) {
                        uVar22 = (ulong)*(byte *)&ppVar13->vertexlist;
                        if (0x20 < uVar22) goto LAB_0011214e;
                        if ((0x100000200U >> (uVar22 & 0x3f) & 1) == 0) break;
                        ppVar13 = (polygon *)((long)&ppVar13->vertexlist + 1);
                      }
                      if ((0x2401UL >> (uVar22 & 0x3f) & 1) == 0) goto LAB_0011214e;
                    }
                    ppVar13 = (polygon *)0x0;
                  }
LAB_0011214e:
                  local_cb8 = ppVar13;
                  local_c90 = strtol((char *)local_cb8,(char **)&local_cb8,0);
                  uVar6 = (uint)local_c90;
                  if (0 < (int)uVar6) {
                    if (local_c7c == 0) {
                      iVar5 = ptVar21->numberoffacets;
                      local_ca8 = pfVar11;
                      if ((long)iVar5 < 1) {
                        pfVar11 = (facet *)operator_new__((ulong)(uVar6 & 0x7fffffff) << 5);
                        ptVar21 = local_cb0;
                        local_cb0->facetlist = pfVar11;
                        piVar14 = (int *)operator_new__((ulong)(uVar6 & 0x7fffffff) << 2);
                        ptVar21->facetmarkerlist = piVar14;
                        pfVar11 = local_ca8;
                      }
                      else {
                        local_c88 = (int *)(ulong)(uVar6 + iVar5);
                        pfVar15 = (facet *)operator_new__((long)local_c88 << 5);
                        piVar16 = (int *)operator_new__((long)local_c88 << 2);
                        pfVar11 = local_cb0->facetlist;
                        piVar14 = local_cb0->facetmarkerlist;
                        lVar10 = 0;
                        do {
                          (&pfVar15->polygonlist)[lVar10] = (polygon *)0x0;
                          (&pfVar15->numberofpolygons)[lVar10 * 2] = 0;
                          (&pfVar15->holelist)[lVar10] = (double *)0x0;
                          (&pfVar15->numberofholes)[lVar10 * 2] = 0;
                          pppVar1 = &pfVar11->polygonlist + lVar10;
                          ppVar9 = *pppVar1;
                          uVar20 = pppVar1[1];
                          ppdVar2 = &pfVar11->holelist + lVar10;
                          uVar4 = ppdVar2[1];
                          (&pfVar15->holelist)[lVar10] = *ppdVar2;
                          (&pfVar15->holelist + lVar10)[1] = (double *)uVar4;
                          (&pfVar15->polygonlist)[lVar10] = ppVar9;
                          (&pfVar15->polygonlist + lVar10)[1] = (polygon *)uVar20;
                          *(undefined4 *)((long)piVar16 + lVar10) =
                               *(undefined4 *)((long)piVar14 + lVar10);
                          lVar10 = lVar10 + 4;
                        } while ((long)iVar5 * 4 != lVar10);
                        if (local_cb0->facetlist != (facet *)0x0) {
                          operator_delete__(local_cb0->facetlist);
                        }
                        pfVar11 = local_ca8;
                        if (local_cb0->facetmarkerlist != (int *)0x0) {
                          local_c88 = piVar16;
                          operator_delete__(local_cb0->facetmarkerlist);
                          piVar16 = local_c88;
                        }
                        local_cb0->facetlist = pfVar15;
                        local_cb0->facetmarkerlist = piVar16;
                        ptVar21 = local_cb0;
                      }
                    }
                    else if (pfVar11 != (facet *)0x0) {
                      ptVar21->numberoftrifaces = uVar6;
                      uVar22 = local_c90 * 4;
                      piVar14 = (int *)operator_new__(local_c90 * 0xc & 0x3fffffffc);
                      ptVar21 = local_cb0;
                      local_cb0->trifacelist = piVar14;
                      piVar14 = (int *)operator_new__(uVar22 & 0x1fffffffc);
                      ptVar21->trifacemarkerlist = piVar14;
                    }
                  }
                  iVar5 = (int)local_c90;
                  if (local_c7c == 0) {
                    lVar10 = (long)ptVar21->numberoffacets;
                    if (iVar5 < 1) {
                      iVar5 = ptVar21->numberoffacets + iVar5;
                    }
                    else {
                      iVar5 = (int)local_c78;
                      local_c50 = (ulong)(uint)(iVar5 * 4);
                      local_c88 = (int *)(ulong)(iVar5 + (uint)(iVar5 == 0));
                      do {
                        ppVar9 = (polygon *)fgets(local_838,0x7ff,__stream);
                        uVar23 = uVar23 + 1;
                        if (ppVar9 == (polygon *)0x0) {
                          ppVar9 = (polygon *)0x0;
                        }
                        else {
                          do {
                            while( true ) {
                              uVar22 = (ulong)*(byte *)&ppVar9->vertexlist;
                              if (0x20 < uVar22) goto LAB_00112527;
                              if ((0x100000200U >> (uVar22 & 0x3f) & 1) == 0) break;
                              ppVar9 = (polygon *)((long)&ppVar9->vertexlist + 1);
                            }
                            if ((0x2401UL >> (uVar22 & 0x3f) & 1) == 0) goto LAB_00112527;
                            ppVar9 = (polygon *)fgets(local_838,0x7ff,__stream);
                            uVar23 = uVar23 + 1;
                          } while (ppVar9 != (polygon *)0x0);
                          ppVar9 = (polygon *)0x0;
                        }
LAB_00112527:
                        local_cb8 = ppVar9;
                        if (ppVar9 == (polygon *)0x0) goto LAB_0011294c;
                        local_ca8 = ptVar21->facetlist;
                        local_ca8[lVar10].polygonlist = (polygon *)0x0;
                        local_ca8[lVar10].holelist = (double *)0x0;
                        local_ca8[lVar10].numberofholes = 0;
                        local_ca8[lVar10].numberofpolygons = 1;
                        local_c48 = lVar10;
                        ppVar9 = (polygon *)operator_new__(0x10);
                        local_ca8[lVar10].polygonlist = ppVar9;
                        ppVar9->vertexlist = (int *)0x0;
                        ppVar9->numberofvertices = (int)local_c78;
                        piVar14 = (int *)operator_new__(local_c50);
                        ppVar9->vertexlist = piVar14;
                        uVar22 = local_ca0;
                        local_ca8 = (facet *)ppVar9;
                        if ((char)local_c68 != '\0') {
                          piVar14 = (int *)0x0;
                          do {
                            if (*(char *)&local_cb8->vertexlist == '\0') goto LAB_00112913;
                            uVar17 = strtol((char *)local_cb8,(char **)&local_cb8,0);
                            *(int *)((long)local_ca8->polygonlist + piVar14 * 4) = (int)uVar17;
                            if ((int)uVar22 < (int)uVar17) {
                              uVar17 = uVar22;
                            }
                            uVar22 = uVar17 & 0xffffffff;
                            while ((0x2c < (ulong)*(byte *)&local_cb8->vertexlist ||
                                   ((0x100900000201U >>
                                     ((ulong)*(byte *)&local_cb8->vertexlist & 0x3f) & 1) == 0))) {
                              local_cb8 = (polygon *)((long)&local_cb8->vertexlist + 1);
                            }
LAB_00112609:
                            uVar17 = (ulong)*(byte *)&local_cb8->vertexlist;
                            if (0x2e < uVar17) {
LAB_0011261e:
                              if (0xf5 < (byte)(*(byte *)&local_cb8->vertexlist - 0x3a))
                              goto LAB_0011262b;
                              local_cb8 = (polygon *)((long)&local_cb8->vertexlist + 1);
                              goto LAB_00112609;
                            }
                            if ((0x680000000001U >> (uVar17 & 0x3f) & 1) != 0) goto LAB_0011262b;
                            if (uVar17 != 0x23) goto LAB_0011261e;
                            *(undefined1 *)&local_cb8->vertexlist = 0;
LAB_0011262b:
                            piVar14 = (int *)((long)piVar14 + 1);
                          } while (piVar14 != local_c88);
                        }
                        lVar10 = local_c48;
                        ptVar21 = local_cb0;
                        local_cb0->facetmarkerlist[local_c48] = 0;
                        local_ca0 = uVar22;
                        if (*(char *)&local_cb8->vertexlist != '\0') {
                          lVar18 = strtol((char *)local_cb8,(char **)&local_cb8,0);
                          ptVar21->facetmarkerlist[lVar10] = (int)lVar18;
                        }
                        lVar10 = lVar10 + 1;
                        lVar18 = (long)(int)local_c90 + (long)ptVar21->numberoffacets;
                      } while (lVar10 < lVar18);
                      iVar5 = (int)lVar18;
                    }
                    ptVar21->numberoffacets = iVar5;
                    ppVar9 = local_c60;
                  }
                  else {
                    local_c98 = (int *)CONCAT44(local_c98._4_4_,iVar5);
                    ppVar9 = local_c60;
                    if ((pfVar11 != (facet *)0x0) &&
                       (local_c98 = (int *)CONCAT44(local_c98._4_4_,iVar5),
                       0 < ptVar21->numberoftrifaces)) {
                      ppVar9 = (polygon *)0x0;
                      do {
                        local_c98 = ptVar21->trifacelist + (long)ppVar9 * 3;
                        local_ca8 = (facet *)ppVar9;
                        while( true ) {
                          ppVar9 = (polygon *)fgets(local_838,0x7ff,__stream);
                          uVar23 = uVar23 + 1;
                          if (ppVar9 == (polygon *)0x0) break;
                          while( true ) {
                            uVar22 = (ulong)*(byte *)&ppVar9->vertexlist;
                            if (0x20 < uVar22) goto LAB_00112394;
                            if ((0x100000200U >> (uVar22 & 0x3f) & 1) == 0) break;
                            ppVar9 = (polygon *)((long)&ppVar9->vertexlist + 1);
                          }
                          if ((0x2401UL >> (uVar22 & 0x3f) & 1) == 0) goto LAB_00112394;
                        }
                        ppVar9 = (polygon *)0x0;
LAB_00112394:
                        local_cb8 = ppVar9;
                        if (ppVar9 == (polygon *)0x0) goto LAB_0011294c;
                        lVar10 = 0;
                        uVar22 = local_ca0;
                        do {
                          if (*(char *)&local_cb8->vertexlist == '\0') goto LAB_00112913;
                          uVar17 = strtol((char *)local_cb8,(char **)&local_cb8,0);
                          ptVar21 = local_cb0;
                          local_c98[lVar10] = (int)uVar17;
                          if ((int)uVar22 < (int)uVar17) {
                            uVar17 = uVar22;
                          }
                          uVar22 = uVar17 & 0xffffffff;
                          while ((0x2c < (ulong)*(byte *)&local_cb8->vertexlist ||
                                 ((0x100900000201U >>
                                   ((ulong)*(byte *)&local_cb8->vertexlist & 0x3f) & 1) == 0))) {
                            local_cb8 = (polygon *)((long)&local_cb8->vertexlist + 1);
                          }
LAB_00112400:
                          uVar17 = (ulong)*(byte *)&local_cb8->vertexlist;
                          if (0x2e < uVar17) {
LAB_00112415:
                            if (0xf5 < (byte)(*(byte *)&local_cb8->vertexlist - 0x3a))
                            goto LAB_00112422;
                            local_cb8 = (polygon *)((long)&local_cb8->vertexlist + 1);
                            goto LAB_00112400;
                          }
                          if ((0x680000000001U >> (uVar17 & 0x3f) & 1) != 0) goto LAB_00112422;
                          if (uVar17 != 0x23) goto LAB_00112415;
                          *(char *)&local_cb8->vertexlist = '\0';
LAB_00112422:
                          lVar10 = lVar10 + 1;
                        } while (lVar10 != 3);
                        local_cb0->trifacemarkerlist[(long)local_ca8] = 0;
                        local_ca0 = uVar22;
                        if (*(char *)&local_cb8->vertexlist != '\0') {
                          lVar10 = strtol((char *)local_cb8,(char **)&local_cb8,0);
                          ptVar21->trifacemarkerlist[(long)local_ca8] = (int)lVar10;
                        }
                        ppVar9 = (polygon *)((long)&local_ca8->polygonlist + 1);
                      } while ((long)ppVar9 < (long)ptVar21->numberoftrifaces);
                      local_c98 = (int *)CONCAT44(local_c98._4_4_,(int)local_c90);
                      ppVar9 = local_c60;
                    }
                  }
                  goto LAB_00111ab8;
                }
              }
              if (0xf5 < (byte)(*(byte *)&ppVar13->vertexlist - 0x3a)) goto LAB_00112106;
              ppVar13 = (polygon *)((long)&ppVar13->vertexlist + 1);
              goto LAB_00111eb0;
            }
          }
        }
        goto LAB_00111ab8;
      }
      fclose(__stream);
      if ((uint)local_ca0 < 2) {
        ptVar21->firstnumber = (uint)local_ca0;
        bVar24 = true;
      }
      else {
        bVar24 = false;
        printf("A wrong smallest index (%d) was detected in file %s\n",local_ca0,local_c38);
      }
    }
  }
  return bVar24;
LAB_0011294c:
  __format = "Unexpected end of file on line %d in file %s\n";
  goto LAB_0011291d;
LAB_00112913:
  __format = "Syntax error reading face on line %d in file %s\n";
LAB_0011291d:
  printf(__format,(ulong)uVar23,local_c38);
  fclose(__stream);
  return false;
}

Assistant:

bool tetgenio::load_medit(char* filebasename, int istetmesh)
{
  FILE *fp;
  tetgenio::facet *tmpflist, *f;
  tetgenio::polygon *p;
  char infilename[FILENAMESIZE];
  char buffer[INPUTLINESIZE];
  char *bufferp, *str;
  double *coord;
  int *tmpfmlist;
  int dimension = 0;
  int nverts = 0;
  int nfaces = 0;
  int ntets = 0;
  int line_count = 0;
  int corners = 0; // 3 (triangle) or 4 (quad).
  int *plist;
  int i, j;

  int smallestidx = 0;

  strncpy(infilename, filebasename, FILENAMESIZE - 1);
  infilename[FILENAMESIZE - 1] = '\0';
  if (infilename[0] == '\0') {
    printf("Error:  No filename.\n");
    return false;
  }
  if (strcmp(&infilename[strlen(infilename) - 5], ".mesh") != 0) {
    strcat(infilename, ".mesh");
  }
  
  if (!(fp = fopen(infilename, "r"))) {
    printf("Error:  Unable to open file %s\n", infilename);
    return false;
  }
  printf("Opening %s.\n", infilename);

  while ((bufferp = readline(buffer, fp, &line_count)) != NULL) {
    if (*bufferp == '#') continue;  // A comment line is skipped.
    if (dimension == 0) {
      // Find if it is the keyword "Dimension".
      str = strstr(bufferp, "Dimension");
      if (!str) str = strstr(bufferp, "dimension");
      if (!str) str = strstr(bufferp, "DIMENSION");
      if (str) {
        // Read the dimensions
        bufferp = findnextnumber(str); // Skip field "Dimension".
        if (*bufferp == '\0') {
          // Read a non-empty line.
          bufferp = readline(buffer, fp, &line_count);
        }
        dimension = (int) strtol(bufferp, &bufferp, 0);
        if (dimension != 2 && dimension != 3) {
          printf("Unknown dimension in file on line %d in file %s\n",
                 line_count, infilename);
          fclose(fp);
          return false;
        }
        mesh_dim = dimension;
      }
    }
    if (nverts == 0) {
      // Find if it is the keyword "Vertices".
      str = strstr(bufferp, "Vertices");
      if (!str) str = strstr(bufferp, "vertices");
      if (!str) str = strstr(bufferp, "VERTICES");
      if (str) {
        // Read the number of vertices.
        bufferp = findnextnumber(str); // Skip field "Vertices".
        if (*bufferp == '\0') {
          // Read a non-empty line.
          bufferp = readline(buffer, fp, &line_count);
        }
        nverts = (int) strtol(bufferp, &bufferp, 0);
        // Initialize the smallest index.
        smallestidx = nverts + 1;
        // Allocate memory for 'tetgenio'
        if (nverts > 0) {
          numberofpoints = nverts;
          pointlist = new REAL[nverts * 3];
        }
        // Read the follwoing node list.
        for (i = 0; i < nverts; i++) {
          bufferp = readline(buffer, fp, &line_count);
          if (bufferp == NULL) {
            printf("Unexpected end of file on line %d in file %s\n",
                   line_count, infilename);
            fclose(fp);
            return false;
          }
          // Read vertex coordinates
          coord = &pointlist[i * 3];
          for (j = 0; j < 3; j++) {
            if (*bufferp == '\0') {
              printf("Syntax error reading vertex coords on line");
              printf(" %d in file %s\n", line_count, infilename);
              fclose(fp);
              return false;
            }
            if ((j < 2) || (dimension == 3)) {
              coord[j] = (REAL) strtod(bufferp, &bufferp);
            } else {
              coord[j] = 0.0;
            }
            bufferp = findnextnumber(bufferp);
          }
        }
        continue;
      }
    }
    if (ntets == 0) {
      // Find if it is the keyword "Tetrahedra"
      corners = 0;
      str = strstr(bufferp, "Tetrahedra");
      if (!str) str = strstr(bufferp, "tetrahedra");
      if (!str) str = strstr(bufferp, "TETRAHEDRA");
      if (str) {
        corners = 4;
      }
      if (corners == 4) {
        // Read the number of tetrahedra
        bufferp = findnextnumber(str); // Skip field "Tetrahedra".
        if (*bufferp == '\0') {
          // Read a non-empty line.
          bufferp = readline(buffer, fp, &line_count);
        }
        ntets = strtol(bufferp, &bufferp, 0);
        if (ntets > 0) {
          // It is a tetrahedral mesh.
          numberoftetrahedra = ntets;
          numberofcorners = 4;
          numberoftetrahedronattributes = 1;
          tetrahedronlist = new int[ntets * 4];
          tetrahedronattributelist = new REAL[ntets];
        }
      } // if (corners == 4)
      // Read the list of tetrahedra.
      for (i = 0; i < numberoftetrahedra; i++) {
        plist = &(tetrahedronlist[i * 4]);
        bufferp = readline(buffer, fp, &line_count);
        if (bufferp == NULL) {
          printf("Unexpected end of file on line %d in file %s\n",
                 line_count, infilename);
          fclose(fp);
          return false;
        }
        // Read the vertices of the tet.
        for (j = 0; j < corners; j++) {
          if (*bufferp == '\0') {
            printf("Syntax error reading face on line %d in file %s\n",
                   line_count, infilename);
            fclose(fp);
            return false;
          }
          plist[j] = (int) strtol(bufferp, &bufferp, 0);
          // Remember the smallest index.
          if (plist[j] < smallestidx) smallestidx = plist[j];
          bufferp = findnextnumber(bufferp);
        }
        // Read the attribute of the tet if it exists.
        tetrahedronattributelist[i] = 0;
        if (*bufferp != '\0') {
          tetrahedronattributelist[i] = (REAL) strtol(bufferp, &bufferp, 0);
        }
      } // i
    } // Tetrahedra
    if (nfaces == 0) {
      // Find if it is the keyword "Triangles" or "Quadrilaterals".
      corners = 0;
      str = strstr(bufferp, "Triangles");
      if (!str) str = strstr(bufferp, "triangles");
      if (!str) str = strstr(bufferp, "TRIANGLES");
      if (str) {
        corners = 3;
      } else {
        str = strstr(bufferp, "Quadrilaterals");
        if (!str) str = strstr(bufferp, "quadrilaterals");
        if (!str) str = strstr(bufferp, "QUADRILATERALS");
        if (str) {
          corners = 4;
        }
      }
      if (corners == 3 || corners == 4) {
        // Read the number of triangles (or quadrilaterals).
        bufferp = findnextnumber(str); // Skip field "Triangles".
        if (*bufferp == '\0') {
          // Read a non-empty line.
          bufferp = readline(buffer, fp, &line_count);
        }
        nfaces = strtol(bufferp, &bufferp, 0);
        // Allocate memory for 'tetgenio'
        if (nfaces > 0) {
          if (!istetmesh) {
            // It is a PLC surface mesh.
            if (numberoffacets > 0) {
              // facetlist has already been allocated. Enlarge arrays.
              // This happens when the surface mesh contains mixed cells.
              tmpflist = new tetgenio::facet[numberoffacets + nfaces];
              tmpfmlist = new int[numberoffacets + nfaces];
              // Copy the data of old arrays into new arrays.
              for (i = 0; i < numberoffacets; i++) {
                f = &(tmpflist[i]);
                tetgenio::init(f);
                *f = facetlist[i];
                tmpfmlist[i] = facetmarkerlist[i];
              }
              // Release old arrays.
              delete [] facetlist;
              delete [] facetmarkerlist;
              // Remember the new arrays.
              facetlist = tmpflist;
              facetmarkerlist = tmpfmlist;
            } else {
              // This is the first time to allocate facetlist.
              facetlist = new tetgenio::facet[nfaces];
              facetmarkerlist = new int[nfaces];
            }
          } else {
            if (corners == 3) {
              // It is a surface mesh of a tetrahedral mesh.
              numberoftrifaces = nfaces;
              trifacelist = new int[nfaces * 3];
              trifacemarkerlist = new int[nfaces];
            }
          }
        } // if (nfaces > 0)
        // Read the following list of faces.
        if (!istetmesh) {
          for (i = numberoffacets; i < numberoffacets + nfaces; i++) {
            bufferp = readline(buffer, fp, &line_count);
            if (bufferp == NULL) {
              printf("Unexpected end of file on line %d in file %s\n",
                     line_count, infilename);
              fclose(fp);
              return false;
            }
            f = &facetlist[i];
            tetgenio::init(f);
            // In .mesh format, each facet has one polygon, no hole.
            f->numberofpolygons = 1;
            f->polygonlist = new tetgenio::polygon[1];
            p = &f->polygonlist[0];
            tetgenio::init(p);
            p->numberofvertices = corners;
            // Allocate memory for face vertices
            p->vertexlist = new int[p->numberofvertices];
            // Read the vertices of the face.
            for (j = 0; j < corners; j++) {
              if (*bufferp == '\0') {
                printf("Syntax error reading face on line %d in file %s\n",
                       line_count, infilename);
                fclose(fp);
                return false;
              }
              p->vertexlist[j] = (int) strtol(bufferp, &bufferp, 0);
              // Remember the smallest index.
              if (p->vertexlist[j] < smallestidx) {
                smallestidx = p->vertexlist[j];
              }
              bufferp = findnextnumber(bufferp);
            }
            // Read the marker of the face if it exists.
            facetmarkerlist[i] = 0;
            if (*bufferp != '\0') {
              facetmarkerlist[i] = (int) strtol(bufferp, &bufferp, 0);
            }
          }
          // Have read in a list of triangles/quads.
          numberoffacets += nfaces;
          nfaces = 0;
        } else {
          // It is a surface mesh of a tetrahedral mesh.
          if (corners == 3) {
            for (i = 0; i < numberoftrifaces; i++) {
              plist = &(trifacelist[i * 3]);
              bufferp = readline(buffer, fp, &line_count);
              if (bufferp == NULL) {
                printf("Unexpected end of file on line %d in file %s\n",
                       line_count, infilename);
                fclose(fp);
                return false;
              }
              // Read the vertices of the face.
              for (j = 0; j < corners; j++) {
                if (*bufferp == '\0') {
                  printf("Syntax error reading face on line %d in file %s\n",
                         line_count, infilename);
                  fclose(fp);
                  return false;
                }
                plist[j] = (int) strtol(bufferp, &bufferp, 0);
                // Remember the smallest index.
                if (plist[j] < smallestidx) {
                  smallestidx = plist[j];
                }
                bufferp = findnextnumber(bufferp);
              }
              // Read the marker of the face if it exists.
              trifacemarkerlist[i] = 0;
              if (*bufferp != '\0') {
                trifacemarkerlist[i] = (int) strtol(bufferp, &bufferp, 0);
              }
            } // i
          } // if (corners == 3)
        } // if (b->refine)
      } // if (corners == 3 || corners == 4)
    }
  }

  // Close file
  fclose(fp);

  // Decide the firstnumber of the index.
  if (smallestidx == 0) {
    firstnumber = 0;  
  } else if (smallestidx == 1) {
    firstnumber = 1;
  } else {
    printf("A wrong smallest index (%d) was detected in file %s\n",
           smallestidx, infilename);
    return false;
  }

  return true;
}